

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

void * address_space_map_ppc
                 (AddressSpace *as,hwaddr addr,hwaddr *plen,_Bool is_write,MemTxAttrs attrs)

{
  uc_struct_conflict7 *puVar1;
  MemoryRegion *pMVar2;
  MemoryRegion *pMVar3;
  void *pvVar4;
  hwaddr done;
  hwaddr hVar5;
  undefined1 lock;
  hwaddr *plen_00;
  hwaddr hVar6;
  hwaddr l;
  hwaddr local_68;
  MemTxAttrs local_5c;
  AddressSpace *local_58;
  FlatView *local_50;
  hwaddr *local_48;
  hwaddr xlat;
  hwaddr xlat_1;
  
  hVar6 = *plen;
  if (hVar6 == 0) {
    return (void *)0x0;
  }
  plen_00 = &l;
  local_50 = as->current_map;
  l = hVar6;
  local_5c = attrs;
  local_58 = as;
  pMVar2 = flatview_translate_ppc
                     ((uc_struct_conflict10 *)as,local_50,addr,&xlat,plen_00,is_write,attrs);
  if ((is_write & pMVar2->ram) == 1) {
    if (pMVar2->readonly != false) {
LAB_0091e62a:
      if (0xfff < l) {
        l = 0x1000;
      }
      pvVar4 = qemu_memalign(0x1000,l);
      puVar1 = pMVar2->uc;
      (puVar1->bounce).buffer = pvVar4;
      (puVar1->bounce).addr = addr;
      (puVar1->bounce).len = l;
      (puVar1->bounce).mr = (MemoryRegion_conflict *)pMVar2;
      if (!is_write) {
        flatview_read((uc_struct_conflict10 *)local_58->uc,local_50,addr,(MemTxAttrs)0x1,pvVar4,l);
        pvVar4 = (pMVar2->uc->bounce).buffer;
      }
      *plen = l;
      return pvVar4;
    }
  }
  else if ((!is_write & pMVar2->ram) == 0) goto LAB_0091e62a;
  local_68 = l;
  hVar5 = 0;
  local_48 = plen;
  while( true ) {
    lock = SUB81(plen_00,0);
    hVar5 = hVar5 + local_68;
    hVar6 = hVar6 - local_68;
    if (hVar6 == 0) break;
    addr = addr + local_68;
    plen_00 = &local_68;
    local_68 = hVar6;
    pMVar3 = flatview_translate_ppc
                       ((uc_struct_conflict10 *)as,local_50,addr,&xlat_1,plen_00,is_write,local_5c);
    lock = SUB81(plen_00,0);
    if ((pMVar3 != pMVar2) || (xlat_1 != xlat + hVar5)) break;
  }
  *local_48 = hVar5;
  pvVar4 = qemu_ram_ptr_length((uc_struct_conflict10 *)local_58->uc,pMVar2->ram_block,xlat,local_48,
                               (_Bool)lock);
  return pvVar4;
}

Assistant:

void *address_space_map(AddressSpace *as,
                        hwaddr addr,
                        hwaddr *plen,
                        bool is_write,
                        MemTxAttrs attrs)
{
    hwaddr len = *plen;
    hwaddr l, xlat;
    MemoryRegion *mr;
    void *ptr;
    FlatView *fv;
    struct uc_struct *uc = as->uc;

    if (len == 0) {
        return NULL;
    }

    l = len;
    fv = address_space_to_flatview(as);
    mr = flatview_translate(uc, fv, addr, &xlat, &l, is_write, attrs);

    if (!memory_access_is_direct(mr, is_write)) {
        /* Avoid unbounded allocations */
        l = MIN(l, TARGET_PAGE_SIZE);
        mr->uc->bounce.buffer = qemu_memalign(TARGET_PAGE_SIZE, l);
        mr->uc->bounce.addr = addr;
        mr->uc->bounce.len = l;

        mr->uc->bounce.mr = mr;
        if (!is_write) {
            flatview_read(as->uc, fv, addr, MEMTXATTRS_UNSPECIFIED,
                               mr->uc->bounce.buffer, l);
        }

        *plen = l;
        return mr->uc->bounce.buffer;
    }


    *plen = flatview_extend_translation(as->uc, fv, addr, len, mr, xlat,
                                        l, is_write, attrs);
    ptr = qemu_ram_ptr_length(as->uc, mr->ram_block, xlat, plen, true);

    return ptr;
}